

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O3

void __thiscall DisjointSetsTest_NewSets_Test::TestBody(DisjointSetsTest_NewSets_Test *this)

{
  char *pcVar1;
  size_t local_70;
  size_t elem2;
  DisjointSets sets;
  size_t local_48;
  size_t elem1;
  Message local_38;
  size_t root1;
  AssertHelper local_28;
  size_t root2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  elem2 = 0;
  sets.info.
  super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sets.info.
  super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = ::wasm::DisjointSets::addSet((DisjointSets *)&elem2);
  local_70 = ::wasm::DisjointSets::addSet((DisjointSets *)&elem2);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)&root2,"elem1","elem2",&local_48,&local_70);
  if ((char)root2 == '\0') {
    testing::Message::Message(&local_38);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/disjoint_sets.cpp"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_38.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_38.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_38.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )::wasm::DisjointSets::getRoot((DisjointSets *)&elem2,local_48);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&root2,"elem1","root1",&local_48,(unsigned_long *)&local_38);
  if ((char)root2 == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&root1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/disjoint_sets.cpp"
               ,0x1d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&root1,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&root1);
    if (local_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_28.data_ + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_28.data_ =
       (AssertHelperData *)::wasm::DisjointSets::getRoot((DisjointSets *)&elem2,local_70);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&root2,"elem2","root2",&local_70,(unsigned_long *)&local_28);
  if ((char)root2 == '\0') {
    testing::Message::Message((Message *)&root1);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&elem1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/disjoint_sets.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&elem1,(Message *)&root1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&elem1);
    if (root1 != 0) {
      (**(code **)(*(long *)root1 + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  if (elem2 != 0) {
    operator_delete((void *)elem2,
                    (long)sets.info.
                          super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - elem2);
  }
  return;
}

Assistant:

TEST(DisjointSetsTest, NewSets) {
  DisjointSets sets;
  auto elem1 = sets.addSet();
  auto elem2 = sets.addSet();
  EXPECT_NE(elem1, elem2);

  auto root1 = sets.getRoot(elem1);
  EXPECT_EQ(elem1, root1);

  auto root2 = sets.getRoot(elem2);
  EXPECT_EQ(elem2, root2);
}